

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondAngleDistribution.cpp
# Opt level: O1

void __thiscall
OpenMD::BondAngleDistribution::BondAngleDistribution
          (BondAngleDistribution *this,SimInfo *info,string *filename,string *sele,double rCut,
          int nbins)

{
  SelectionEvaluator *this_00;
  pointer pcVar1;
  long *plVar2;
  ostream *this_01;
  OpenMDBitSet *pOVar3;
  long lVar4;
  string paramString;
  stringstream params;
  string local_1f0;
  SelectionManager *local_1d0;
  string *local_1c8;
  RealType local_1c0;
  undefined1 local_1b8 [16];
  OpenMDBitSet local_1a8 [2];
  ios_base local_138 [264];
  
  local_1c0 = rCut;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__BondAngleDistribution_00339b88;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)&(this->selectionScript_).field_2;
  pcVar1 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript_,pcVar1,pcVar1 + sele->_M_string_length);
  local_1d0 = &this->seleMan_;
  local_1c8 = &this->selectionScript_;
  SelectionManager::SelectionManager(local_1d0,info);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->ThetaCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->ThetaCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->ThetaCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Bond Angle Distribution","");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  getPrefix(&local_1f0,filename);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  pOVar3 = (OpenMDBitSet *)(plVar2 + 2);
  if ((OpenMDBitSet *)*plVar2 == pOVar3) {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar3->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._8_8_ = plVar2[3];
    local_1b8._0_8_ = local_1a8;
  }
  else {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar3->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1b8._0_8_ = (OpenMDBitSet *)*plVar2;
  }
  local_1b8._8_8_ = plVar2[1];
  *plVar2 = (long)pOVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_00);
    lVar4 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar4),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  this->rCut_ = local_1c0;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," rcut = ",8);
  this_01 = std::ostream::_M_insert<double>(this->rCut_);
  std::__ostream_insert<char,std::char_traits<char>>(this_01,", nbins = ",10);
  std::ostream::operator<<((ostream *)this_01,this->nBins_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  this->deltaTheta_ = 180.0 / (double)this->nBins_;
  std::vector<int,_std::allocator<int>_>::resize(&this->histogram_,(long)this->nBins_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

BondAngleDistribution::BondAngleDistribution(SimInfo* info,
                                               const string& filename,
                                               const string& sele, double rCut,
                                               int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setAnalysisType("Bond Angle Distribution");
    setOutputName(getPrefix(filename) + ".bad");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius:

    rCut_ = rCut;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << nBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    // Theta can take values from 0 to 180

    deltaTheta_ = (180.0) / nBins_;
    histogram_.resize(nBins_);
  }